

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaTabBar::contextMenuEvent(QMdiAreaTabBar *this,QContextMenuEvent *event)

{
  QMdiSubWindowPrivate *this_00;
  bool bVar1;
  int iVar2;
  QMdiSubWindow *p;
  QWidget *this_01;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  iVar2 = QTabBar::tabAt(&this->super_QTabBar,(QPoint *)(event + 0x28));
  p = subWindowFromIndex(this,iVar2);
  QPointer<QMdiSubWindow>::QPointer<void>((QPointer<QMdiSubWindow> *)&local_38,p);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
  if ((bVar1) && ((*(byte *)(*(long *)(local_38.value + 0x20) + 10) & 1) == 0)) {
    this_00 = *(QMdiSubWindowPrivate **)(local_38.value + 8);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this_00->systemMenu);
    if (bVar1) {
      iVar2 = QTabBar::currentIndex(&this->super_QTabBar);
      this_01 = &subWindowFromIndex(this,iVar2)->super_QWidget;
      bVar1 = QWidget::isMaximized(this_01);
      if (bVar1) {
        QMdiSubWindowPrivate::setVisible(this_00,MoveAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,ResizeAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,MinimizeAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,MaximizeAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,RestoreAction,false);
        QMdiSubWindowPrivate::setVisible(this_00,StayOnTopAction,false);
      }
      QMenu::exec((QMenu *)(this_00->systemMenu).wp.value,(QPoint *)(event + 0x30),(QAction *)0x0);
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
      if (bVar1) {
        QMdiSubWindowPrivate::updateActions(this_00);
      }
      goto LAB_0040b37a;
    }
  }
  event[0xc] = (QContextMenuEvent)0x0;
LAB_0040b37a:
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaTabBar::contextMenuEvent(QContextMenuEvent *event)
{
    QPointer<QMdiSubWindow> subWindow = subWindowFromIndex(tabAt(event->pos()));
    if (!subWindow || subWindow->isHidden()) {
        event->ignore();
        return;
    }

#if QT_CONFIG(menu)
    QMdiSubWindowPrivate *subWindowPrivate = subWindow->d_func();
    if (!subWindowPrivate->systemMenu) {
        event->ignore();
        return;
    }

    QMdiSubWindow *currentSubWindow = subWindowFromIndex(currentIndex());
    Q_ASSERT(currentSubWindow);

    // We don't want these actions to show up in the system menu when the
    // current sub-window is maximized, i.e. covers the entire viewport.
    if (currentSubWindow->isMaximized()) {
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MoveAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::ResizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MinimizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MaximizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::RestoreAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::StayOnTopAction, false);
    }

    // Show system menu.
    subWindowPrivate->systemMenu->exec(event->globalPos());
    if (!subWindow)
        return;

    // Restore action visibility.
    subWindowPrivate->updateActions();
#endif // QT_CONFIG(menu)
}